

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptParser.cpp
# Opt level: O0

void MiniScript::AllowLineBreak(Lexer *tokens)

{
  bool bVar1;
  byte local_69;
  Token local_60;
  Token local_30;
  Lexer *local_10;
  Lexer *tokens_local;
  
  local_10 = tokens;
  while( true ) {
    Lexer::Peek(&local_30,tokens);
    local_69 = 0;
    if (local_30.type == EOL) {
      bVar1 = Lexer::atEnd(tokens);
      local_69 = bVar1 ^ 0xff;
    }
    Token::~Token(&local_30);
    if ((local_69 & 1) == 0) break;
    Lexer::Dequeue(&local_60,tokens);
    Token::~Token(&local_60);
  }
  return;
}

Assistant:

static void AllowLineBreak(Lexer tokens) {
		while (tokens.Peek().type == Token::Type::EOL && not tokens.atEnd()) tokens.Dequeue();
	}